

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_configchg.c
# Opt level: O0

ares_status_t ares_event_configchg_init(ares_event_configchg_t **configchg,ares_event_thread_t *e)

{
  int iVar1;
  ares_event_configchg_t *data;
  ares_event_configchg_t *c;
  ares_status_t status;
  ares_event_thread_t *e_local;
  ares_event_configchg_t **configchg_local;
  
  *configchg = (ares_event_configchg_t *)0x0;
  data = (ares_event_configchg_t *)ares_malloc_zero(0x10);
  if (data == (ares_event_configchg_t *)0x0) {
    configchg_local._4_4_ = ARES_ENOMEM;
  }
  else {
    data->e = e;
    iVar1 = inotify_init1(0x80800);
    data->inotify_fd = iVar1;
    if (data->inotify_fd == -1) {
      c._4_4_ = ARES_ESERVFAIL;
    }
    else {
      iVar1 = inotify_add_watch(data->inotify_fd,"/etc",0x1000182);
      if (iVar1 == -1) {
        c._4_4_ = ARES_ESERVFAIL;
      }
      else {
        c._4_4_ = ares_event_update((ares_event_t **)0x0,e,ARES_EVENT_FLAG_READ,
                                    ares_event_configchg_cb,data->inotify_fd,data,
                                    ares_event_configchg_free,(ares_event_signal_cb_t)0x0);
      }
    }
    if (c._4_4_ == ARES_SUCCESS) {
      *configchg = data;
    }
    else {
      ares_event_configchg_free(data);
    }
    configchg_local._4_4_ = c._4_4_;
  }
  return configchg_local._4_4_;
}

Assistant:

ares_status_t ares_event_configchg_init(ares_event_configchg_t **configchg,
                                        ares_event_thread_t     *e)
{
  ares_status_t           status = ARES_SUCCESS;
  ares_event_configchg_t *c;

  (void)e;

  /* Not used by this implementation */
  *configchg = NULL;

  c = ares_malloc_zero(sizeof(*c));
  if (c == NULL) {
    return ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  c->e          = e;
  c->inotify_fd = inotify_init1(IN_NONBLOCK | IN_CLOEXEC);
  if (c->inotify_fd == -1) {
    status = ARES_ESERVFAIL; /* LCOV_EXCL_LINE: UntestablePath */
    goto done;               /* LCOV_EXCL_LINE: UntestablePath */
  }

  /* We need to monitor /etc/resolv.conf, /etc/nsswitch.conf */
  if (inotify_add_watch(c->inotify_fd, "/etc",
                        IN_CREATE | IN_MODIFY | IN_MOVED_TO | IN_ONLYDIR) ==
      -1) {
    status = ARES_ESERVFAIL; /* LCOV_EXCL_LINE: UntestablePath */
    goto done;               /* LCOV_EXCL_LINE: UntestablePath */
  }

  status =
    ares_event_update(NULL, e, ARES_EVENT_FLAG_READ, ares_event_configchg_cb,
                      c->inotify_fd, c, ares_event_configchg_free, NULL);

done:
  if (status != ARES_SUCCESS) {
    ares_event_configchg_free(c);
  } else {
    *configchg = c;
  }
  return status;
}